

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_183fe20::AV1LosslessFrameSizeTests_LosslessEncode_Test::TestBody
          (AV1LosslessFrameSizeTests_LosslessEncode_Test *this)

{
  undefined1 *puVar1;
  bool bVar2;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RandomVideoSource video;
  AssertHelper local_70;
  HasNewFatalFailureHelper local_68;
  undefined1 local_50 [56];
  
  local_50._0_8_ = &PTR__DummyVideoSource_01074718;
  local_50._8_8_ = (aom_image_t *)0x0;
  local_50._24_4_ = 100;
  local_50._32_4_ = 0x50;
  local_50._36_4_ = 0x40;
  local_50._40_4_ = AOM_IMG_FMT_I420;
  libaom_test::DummyVideoSource::ReallocImage((DummyVideoSource *)local_50);
  local_50._0_8_ = &PTR__DummyVideoSource_01087218;
  local_50._44_8_ = 0xbaba0000baba;
  puVar1 = &(this->super_AV1LosslessFrameSizeTests).super_EncoderTest.field_0x3dc;
  if ((local_50._32_4_ != *(uint *)puVar1) ||
     (local_50._36_4_ != *(uint *)&(this->super_AV1LosslessFrameSizeTests).field_0x3f8)) {
    local_50._32_8_ = *(undefined8 *)puVar1;
    libaom_test::DummyVideoSource::ReallocImage((DummyVideoSource *)local_50);
  }
  local_50._24_4_ = 10;
  (this->super_AV1LosslessFrameSizeTests).expected_res_ = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(&local_68);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      (*(this->super_AV1LosslessFrameSizeTests).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_AV1LosslessFrameSizeTests).super_EncoderTest,local_50);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper(&local_68);
    if (local_68.has_new_fatal_failure_ == false) goto LAB_006799f6;
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
             ,0x17c,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68.super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface !=
      (_func_int **)0x0) {
    (**(code **)(*local_68.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_006799f6:
  local_50._0_8_ = &PTR__DummyVideoSource_01074718;
  aom_img_free((aom_image_t *)local_50._8_8_);
  return;
}

Assistant:

TEST_P(AV1LosslessFrameSizeTests, LosslessEncode) {
  ::libaom_test::RandomVideoSource video;

  video.SetSize(frame_size_param_.width, frame_size_param_.height);
  video.set_limit(10);
  expected_res_ = AOM_CODEC_OK;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}